

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
FourByteUtf8ChineseCharacters_IndexStdString_Test::
~FourByteUtf8ChineseCharacters_IndexStdString_Test
          (FourByteUtf8ChineseCharacters_IndexStdString_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (FourByteUtf8ChineseCharacters, IndexStdString) {
    std::string::const_iterator begin = std::begin (str);
    std::string::const_iterator end = std::end (str);

    auto it = begin;
    ASSERT_EQ (it, pstore::utf::index (begin, end, 0));
    std::advance (it, 4);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 1));
    std::advance (it, 4);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 2));
    std::advance (it, 4);
    ASSERT_EQ (it, pstore::utf::index (begin, end, 3));

    ASSERT_EQ (end, pstore::utf::index (begin, end, 4));
}